

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uchar GetArgumentRegister(ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,
                         RegVmLoweredBlock *lowBlock,VmValue *value)

{
  bool bVar1;
  uint uVar2;
  uchar *puVar3;
  VmFunction *pVVar4;
  uchar targetReg;
  VmFunction *function;
  undefined1 local_68 [8];
  SmallArray<unsigned_char,_32U> result;
  VmValue *value_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  result.allocator = (Allocator *)value;
  bVar1 = isType<VmConstant>(value);
  if (bVar1) {
    SmallArray<unsigned_char,_32U>::SmallArray
              ((SmallArray<unsigned_char,_32U> *)local_68,ctx->allocator);
    LowerConstantIntoBlock
              (ctx,lowFunction,lowBlock,(SmallArray<unsigned_char,_32U> *)local_68,
               (VmValue *)result.allocator);
    uVar2 = SmallArray<unsigned_char,_32U>::size((SmallArray<unsigned_char,_32U> *)local_68);
    if (uVar2 != 1) {
      __assert_fail("result.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x247,
                    "unsigned char GetArgumentRegister(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmValue *)"
                   );
    }
    puVar3 = SmallArray<unsigned_char,_32U>::back((SmallArray<unsigned_char,_32U> *)local_68);
    ctx_local._7_1_ = *puVar3;
    SmallArray<unsigned_char,_32U>::~SmallArray((SmallArray<unsigned_char,_32U> *)local_68);
  }
  else {
    pVVar4 = getType<VmFunction>((VmValue *)result.allocator);
    if (pVVar4 == (VmFunction *)0x0) {
      ctx_local._7_1_ = RegVmLoweredFunction::GetRegister(lowFunction,(VmValue *)result.allocator);
    }
    else {
      ctx_local._7_1_ = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
      RegVmLoweredBlock::AddInstruction
                (lowBlock,ctx,(pVVar4->super_VmValue).source,rviFuncAddr,ctx_local._7_1_,'\0','\0',
                 pVVar4->function->functionIndex);
    }
  }
  return ctx_local._7_1_;
}

Assistant:

unsigned char GetArgumentRegister(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmValue *value)
{
	if(isType<VmConstant>(value))
	{
		SmallArray<unsigned char, 32> result(ctx.allocator);

		LowerConstantIntoBlock(ctx, lowFunction, lowBlock, result, value);

		assert(result.size() == 1);

		return result.back();
	}

	if(VmFunction *function = getType<VmFunction>(value))
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, function->source, rviFuncAddr, targetReg, 0, 0, function->function->functionIndex);

		return targetReg;
	}

	return lowFunction->GetRegister(value);
}